

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,int n)

{
  TValue *pTVar1;
  GCtab *t_00;
  ulong uVar2;
  uint in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *src;
  TValue *dst;
  GCtab *t;
  GCobj *o;
  TValue *local_78;
  undefined8 in_stack_ffffffffffffff98;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  t_00 = (GCtab *)(ulong)(pTVar1->u32).lo;
  if (in_EDX < t_00->asize) {
    local_78 = (TValue *)((ulong)(t_00->array).ptr32 + (long)(int)in_EDX * 8);
  }
  else {
    local_78 = lj_tab_setinth((lua_State *)CONCAT44(in_ESI,in_EDX),t_00,
                              (int32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  pTVar1 = in_RDI->top;
  *local_78 = pTVar1[-1];
  if (((0xfffffff6 < (local_78->field_2).it + 4) &&
      ((*(byte *)((ulong)(local_78->u32).lo + 4) & 3) != 0)) && ((t_00->marked & 4) != 0)) {
    uVar2 = (ulong)(in_RDI->glref).ptr32;
    t_00->marked = t_00->marked & 0xfb;
    (t_00->gclist).gcptr32 = *(uint32_t *)(uVar2 + 0x6c);
    *(int *)(uVar2 + 0x6c) = (int)t_00;
  }
  in_RDI->top = pTVar1 + -1;
  return;
}

Assistant:

LUA_API void lua_rawseti(lua_State *L, int idx, int n)
{
  GCtab *t = tabV(index2adr(L, idx));
  TValue *dst, *src;
  lj_checkapi_slot(1);
  dst = lj_tab_setint(L, t, n);
  src = L->top-1;
  copyTV(L, dst, src);
  lj_gc_barriert(L, t, dst);
  L->top = src;
}